

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void dump_nettlp(nettlp *nt)

{
  char *pcVar1;
  in_addr_t *in_RDI;
  
  printf("======== struct nettlp ========\n");
  printf("port:        %d\n",(ulong)(ushort)in_RDI[5]);
  pcVar1 = inet_ntoa((in_addr)*in_RDI);
  printf("remote_addr: %s\n",pcVar1);
  pcVar1 = inet_ntoa((in_addr)in_RDI[1]);
  printf("local_addr:  %s\n",pcVar1);
  printf("requester:   %02x:%02x\n",(ulong)(uint)((int)((ushort)in_RDI[2] & 0xff00) >> 8),
         (ulong)((ushort)in_RDI[2] & 0xff));
  printf("sockfd:      %d\n",(ulong)in_RDI[4]);
  printf("===============================\n");
  return;
}

Assistant:

void dump_nettlp(struct nettlp *nt)
{
	printf("======== struct nettlp ========\n");
	printf("port:        %d\n", nt->port);
	printf("remote_addr: %s\n", inet_ntoa(nt->remote_addr));
	printf("local_addr:  %s\n", inet_ntoa(nt->local_addr));
	printf("requester:   %02x:%02x\n",
	       (nt->requester & 0xFF00) >> 8, nt->requester & 0x00FF);
	printf("sockfd:      %d\n", nt->sockfd);
	printf("===============================\n");
}